

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iffl_list.h
# Opt level: O2

sizes_t * __thiscall
iffl::
flat_forward_list<pod_array_list_entry<char>,_flat_forward_list_traits_unaligned<char>,_std::pmr::polymorphic_allocator<char>_>
::get_all_sizes(sizes_t *__return_storage_ptr__,
               flat_forward_list<pod_array_list_entry<char>,_flat_forward_list_traits_unaligned<char>,_std::pmr::polymorphic_allocator<char>_>
               *this)

{
  ulong uVar1;
  const_iterator local_18;
  
  (__return_storage_ptr__->last_element).super_range.buffer_end = 0;
  (__return_storage_ptr__->last_element).super_range.buffer_begin = 0;
  (__return_storage_ptr__->last_element).super_range.data_end = 0;
  uVar1 = (long)(this->buffer_).v2_.end - (long)(this->buffer_).v2_.begin;
  __return_storage_ptr__->total_capacity = uVar1;
  local_18.p_ = (this->buffer_).v2_.last;
  if (local_18.p_ != (pointer_type)0x0) {
    range_unsafe(&__return_storage_ptr__->last_element,this,&local_18);
    if (uVar1 < (__return_storage_ptr__->last_element).super_range.data_end) {
      std::terminate();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

sizes_t get_all_sizes() const noexcept {
        sizes_t s;

        s.total_capacity = buff().end - buff().begin;

        if (nullptr != buff().last) {
            s.last_element = range_unsafe(const_iterator{ buff().last });
        }
        FFL_CODDING_ERROR_IF(s.total_capacity < s.used_capacity().size);

        return s;
    }